

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O0

void __thiscall
CsvModelSerialiserPrivate::CsvModelSerialiserPrivate
          (CsvModelSerialiserPrivate *this,CsvModelSerialiser *q)

{
  QLatin1Char local_1b;
  QChar local_1a;
  CsvModelSerialiser *local_18;
  CsvModelSerialiser *q_local;
  CsvModelSerialiserPrivate *this_local;
  
  local_18 = q;
  q_local = (CsvModelSerialiser *)this;
  AbstractSingleRoleSerialiserPrivate::AbstractSingleRoleSerialiserPrivate
            (&this->super_AbstractSingleRoleSerialiserPrivate,&q->super_AbstractSingleRoleSerialiser
            );
  this->m_firstRowIsHeader = true;
  this->m_firstColumnIsHeader = true;
  QLatin1Char::QLatin1Char(&local_1b,',');
  QChar::QChar(&local_1a,local_1b);
  QString::QString(&this->m_csvSeparator,(QChar *)(ulong)(ushort)local_1a.ucs);
  return;
}

Assistant:

CsvModelSerialiserPrivate::CsvModelSerialiserPrivate(CsvModelSerialiser *q)
    : AbstractSingleRoleSerialiserPrivate(q)
    , m_firstRowIsHeader(true)
    , m_firstColumnIsHeader(true)
    , m_csvSeparator(QLatin1Char(','))
{ }